

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcDoorStyle::~IfcDoorStyle(IfcDoorStyle *this,void **vtt)

{
  void **vtt_local;
  IfcDoorStyle *this_local;
  
  *(void **)&(this->super_IfcTypeProduct).super_IfcTypeObject = *vtt;
  *(void **)(&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x0 +
            *(long *)(*(long *)&(this->super_IfcTypeProduct).super_IfcTypeObject + -0x18)) =
       vtt[0x19];
  *(void **)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x88 = vtt[0x1a];
  (this->super_IfcTypeProduct).super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x1b];
  *(void **)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0xf0 = vtt[0x1c];
  *(void **)&(this->super_IfcTypeProduct).field_0x148 = vtt[0x1d];
  std::__cxx11::string::~string((string *)&this->Sizeable);
  std::__cxx11::string::~string((string *)&this->ParameterTakesPrecedence);
  std::__cxx11::string::~string((string *)&this->ConstructionType);
  std::__cxx11::string::~string((string *)&(this->super_IfcTypeProduct).field_0x158);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcDoorStyle,_4UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcDoorStyle,_4UL> *)
             &(this->super_IfcTypeProduct).field_0x148,vtt + 0x17);
  IfcTypeProduct::~IfcTypeProduct(&this->super_IfcTypeProduct,vtt + 1);
  return;
}

Assistant:

IfcDoorStyle() : Object("IfcDoorStyle") {}